

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

void fill_window(deflate_state *s)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  ulong local_30;
  ulg init;
  ulg curr;
  uInt str;
  uInt wsize;
  uint more;
  uint n;
  deflate_state *s_local;
  
  uVar1 = s->w_size;
  do {
    str = ((int)s->window_size - s->lookahead) - s->strstart;
    if (uVar1 + (s->w_size - 0x106) <= s->strstart) {
      memcpy(s->window,s->window + uVar1,(ulong)(uVar1 - str));
      s->match_start = s->match_start - uVar1;
      s->strstart = s->strstart - uVar1;
      s->block_start = s->block_start - (ulong)uVar1;
      if (s->strstart < s->insert) {
        s->insert = s->strstart;
      }
      slide_hash(s);
      str = uVar1 + str;
    }
    if (s->strm->avail_in == 0) break;
    uVar2 = read_buf(s->strm,s->window + (ulong)s->lookahead + (ulong)s->strstart,str);
    s->lookahead = uVar2 + s->lookahead;
    if (2 < s->lookahead + s->insert) {
      curr._0_4_ = s->strstart - s->insert;
      s->ins_h = (uint)s->window[(uint)curr];
      s->ins_h = (s->ins_h << ((byte)s->hash_shift & 0x1f) ^ (uint)s->window[(uint)curr + 1]) &
                 s->hash_mask;
      do {
        if (s->insert == 0) break;
        s->ins_h = (s->ins_h << ((byte)s->hash_shift & 0x1f) ^ (uint)s->window[(uint)curr + 2]) &
                   s->hash_mask;
        s->prev[(uint)curr & s->w_mask] = s->head[s->ins_h];
        s->head[s->ins_h] = (Posf)(uint)curr;
        curr._0_4_ = (uint)curr + 1;
        s->insert = s->insert - 1;
      } while (2 < s->lookahead + s->insert);
    }
    bVar4 = false;
    if (s->lookahead < 0x106) {
      bVar4 = s->strm->avail_in != 0;
    }
  } while (bVar4);
  if (s->high_water < s->window_size) {
    uVar3 = (ulong)s->strstart + (ulong)s->lookahead;
    if (s->high_water < uVar3) {
      local_30 = s->window_size - uVar3;
      if (0x102 < local_30) {
        local_30 = 0x102;
      }
      memset(s->window + uVar3,0,local_30 & 0xffffffff);
      s->high_water = uVar3 + local_30;
    }
    else if (s->high_water < uVar3 + 0x102) {
      local_30 = (uVar3 + 0x102) - s->high_water;
      if (s->window_size - s->high_water < local_30) {
        local_30 = s->window_size - s->high_water;
      }
      memset(s->window + s->high_water,0,local_30 & 0xffffffff);
      s->high_water = local_30 + s->high_water;
    }
  }
  return;
}

Assistant:

local void fill_window(deflate_state *s) {
    unsigned n;
    unsigned more;    /* Amount of free space at the end of the window. */
    uInt wsize = s->w_size;

    Assert(s->lookahead < MIN_LOOKAHEAD, "already enough lookahead");

    do {
        more = (unsigned)(s->window_size -(ulg)s->lookahead -(ulg)s->strstart);

        /* Deal with !@#$% 64K limit: */
        if (sizeof(int) <= 2) {
            if (more == 0 && s->strstart == 0 && s->lookahead == 0) {
                more = wsize;

            } else if (more == (unsigned)(-1)) {
                /* Very unlikely, but possible on 16 bit machine if
                 * strstart == 0 && lookahead == 1 (input done a byte at time)
                 */
                more--;
            }
        }

        /* If the window is almost full and there is insufficient lookahead,
         * move the upper half to the lower one to make room in the upper half.
         */
        if (s->strstart >= wsize + MAX_DIST(s)) {

            zmemcpy(s->window, s->window + wsize, (unsigned)wsize - more);
            s->match_start -= wsize;
            s->strstart    -= wsize; /* we now have strstart >= MAX_DIST */
            s->block_start -= (long) wsize;
            if (s->insert > s->strstart)
                s->insert = s->strstart;
            slide_hash(s);
            more += wsize;
        }
        if (s->strm->avail_in == 0) break;

        /* If there was no sliding:
         *    strstart <= WSIZE+MAX_DIST-1 && lookahead <= MIN_LOOKAHEAD - 1 &&
         *    more == window_size - lookahead - strstart
         * => more >= window_size - (MIN_LOOKAHEAD-1 + WSIZE + MAX_DIST-1)
         * => more >= window_size - 2*WSIZE + 2
         * In the BIG_MEM or MMAP case (not yet supported),
         *   window_size == input_size + MIN_LOOKAHEAD  &&
         *   strstart + s->lookahead <= input_size => more >= MIN_LOOKAHEAD.
         * Otherwise, window_size == 2*WSIZE so more >= 2.
         * If there was sliding, more >= WSIZE. So in all cases, more >= 2.
         */
        Assert(more >= 2, "more < 2");

        n = read_buf(s->strm, s->window + s->strstart + s->lookahead, more);
        s->lookahead += n;

        /* Initialize the hash value now that we have some input: */
        if (s->lookahead + s->insert >= MIN_MATCH) {
            uInt str = s->strstart - s->insert;
            s->ins_h = s->window[str];
            UPDATE_HASH(s, s->ins_h, s->window[str + 1]);
#if MIN_MATCH != 3
            Call UPDATE_HASH() MIN_MATCH-3 more times
#endif
            while (s->insert) {
                UPDATE_HASH(s, s->ins_h, s->window[str + MIN_MATCH-1]);
#ifndef FASTEST
                s->prev[str & s->w_mask] = s->head[s->ins_h];
#endif
                s->head[s->ins_h] = (Pos)str;
                str++;
                s->insert--;
                if (s->lookahead + s->insert < MIN_MATCH)
                    break;
            }
        }
        /* If the whole input has less than MIN_MATCH bytes, ins_h is garbage,
         * but this is not important since only literal bytes will be emitted.
         */

    } while (s->lookahead < MIN_LOOKAHEAD && s->strm->avail_in != 0);

    /* If the WIN_INIT bytes after the end of the current data have never been
     * written, then zero those bytes in order to avoid memory check reports of
     * the use of uninitialized (or uninitialised as Julian writes) bytes by
     * the longest match routines.  Update the high water mark for the next
     * time through here.  WIN_INIT is set to MAX_MATCH since the longest match
     * routines allow scanning to strstart + MAX_MATCH, ignoring lookahead.
     */
    if (s->high_water < s->window_size) {
        ulg curr = s->strstart + (ulg)(s->lookahead);
        ulg init;

        if (s->high_water < curr) {
            /* Previous high water mark below current data -- zero WIN_INIT
             * bytes or up to end of window, whichever is less.
             */
            init = s->window_size - curr;
            if (init > WIN_INIT)
                init = WIN_INIT;
            zmemzero(s->window + curr, (unsigned)init);
            s->high_water = curr + init;
        }
        else if (s->high_water < (ulg)curr + WIN_INIT) {
            /* High water mark at or above current data, but below current data
             * plus WIN_INIT -- zero out to current data plus WIN_INIT, or up
             * to end of window, whichever is less.
             */
            init = (ulg)curr + WIN_INIT - s->high_water;
            if (init > s->window_size - s->high_water)
                init = s->window_size - s->high_water;
            zmemzero(s->window + s->high_water, (unsigned)init);
            s->high_water += init;
        }
    }

    Assert((ulg)s->strstart <= s->window_size - MIN_LOOKAHEAD,
           "not enough room for search");
}